

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O0

bool __thiscall dap::json::JsonCppDeserializer::deserialize(JsonCppDeserializer *this,any *v)

{
  bool bVar1;
  ValueType VVar2;
  uint uVar3;
  Int64 i;
  double i_00;
  nullptr_t local_c8;
  undefined1 local_c0 [8];
  array<any> arr;
  undefined1 local_a0 [8];
  object obj;
  String local_58;
  integer local_38;
  number local_30;
  boolean local_21;
  any *local_20;
  any *v_local;
  JsonCppDeserializer *this_local;
  
  local_20 = v;
  v_local = (any *)this;
  bVar1 = Json::Value::isBool(this->json);
  if (bVar1) {
    bVar1 = Json::Value::asBool(this->json);
    boolean::boolean(&local_21,bVar1);
    any::operator=(local_20,&local_21);
  }
  else {
    VVar2 = Json::Value::type(this->json);
    if (VVar2 == realValue) {
      i_00 = Json::Value::asDouble(this->json);
      number::number(&local_30,i_00);
      any::operator=(local_20,&local_30);
    }
    else {
      bVar1 = Json::Value::isInt64(this->json);
      if (bVar1) {
        i = Json::Value::asInt64(this->json);
        integer::integer(&local_38,i);
        any::operator=(local_20,&local_38);
      }
      else {
        bVar1 = Json::Value::isString(this->json);
        if (bVar1) {
          Json::Value::asString_abi_cxx11_(&local_58,this->json);
          any::operator=(local_20,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
        }
        else {
          bVar1 = Json::Value::isObject(this->json);
          if (bVar1) {
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
            ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                             *)local_a0);
            uVar3 = (*(this->super_Deserializer)._vptr_Deserializer[6])
                              (this,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                                     *)local_a0);
            bVar1 = (uVar3 & 1) != 0;
            if (bVar1) {
              any::operator=(local_20,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                                       *)local_a0);
            }
            else {
              this_local._7_1_ = 0;
            }
            arr.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
            arr.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
            ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                              *)local_a0);
          }
          else {
            bVar1 = Json::Value::isArray(this->json);
            if (!bVar1) {
              bVar1 = Json::Value::isNull(this->json);
              if (!bVar1) {
                this_local._7_1_ = 0;
                goto LAB_011daf50;
              }
              local_c8 = (nullptr_t)0x0;
              any::operator=(local_20,&local_c8);
              goto LAB_011daf4c;
            }
            std::vector<dap::any,_std::allocator<dap::any>_>::vector
                      ((vector<dap::any,_std::allocator<dap::any>_> *)local_c0);
            bVar1 = deserialize<dap::any>
                              (this,(vector<dap::any,_std::allocator<dap::any>_> *)local_c0);
            if (bVar1) {
              any::operator=(local_20,(vector<dap::any,_std::allocator<dap::any>_> *)local_c0);
            }
            else {
              this_local._7_1_ = 0;
            }
            arr.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
            arr.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
            std::vector<dap::any,_std::allocator<dap::any>_>::~vector
                      ((vector<dap::any,_std::allocator<dap::any>_> *)local_c0);
          }
          if (arr.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_011daf50;
        }
      }
    }
  }
LAB_011daf4c:
  this_local._7_1_ = 1;
LAB_011daf50:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool JsonCppDeserializer::deserialize(dap::any* v) const {
  if (json->isBool()) {
    *v = dap::boolean(json->asBool());
  } else if (json->type() == Json::ValueType::realValue) {
    // json->isDouble() returns true for integers as well, so we need to
    // explicitly look for the realValue type.
    *v = dap::number(json->asDouble());
  } else if (json->isInt64()) {
    *v = dap::integer(json->asInt64());
  } else if (json->isString()) {
    *v = json->asString();
  } else if (json->isObject()) {
    dap::object obj;
    if (!deserialize(&obj)) {
      return false;
    }
    *v = obj;
  } else if (json->isArray()) {
    dap::array<any> arr;
    if (!deserialize(&arr)) {
      return false;
    }
    *v = arr;
  } else if (json->isNull()) {
    *v = null();
  } else {
    return false;
  }
  return true;
}